

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O0

void __thiscall Outputs::Display::BufferingScanTarget::end_scan(BufferingScanTarget *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock_guard;
  BufferingScanTarget *this_local;
  
  lock_guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->producer_mutex_);
  if ((this->scan_is_ongoing_ & 1U) != 0) {
    this->scan_is_ongoing_ = false;
    if (this->vended_scan_ != (Scan *)0x0) {
      this->vended_scan_->data_y = (uint16_t)(this->vended_write_area_pointer_ >> 0xb);
      this->vended_scan_->line = (this->write_pointers_).line;
      (this->vended_scan_->scan).end_points[0].data_offset =
           (this->vended_scan_->scan).end_points[0].data_offset +
           ((ushort)this->vended_write_area_pointer_ & 0x7ff);
      (this->vended_scan_->scan).end_points[1].data_offset =
           (this->vended_scan_->scan).end_points[1].data_offset +
           ((ushort)this->vended_write_area_pointer_ & 0x7ff);
      this->vended_scan_ = (Scan *)0x0;
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_18);
    return;
  }
  __assert_fail("scan_is_ongoing_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp"
                ,0xaf,"virtual void Outputs::Display::BufferingScanTarget::end_scan()");
}

Assistant:

void BufferingScanTarget::end_scan() {
	std::lock_guard lock_guard(producer_mutex_);

#ifndef NDEBUG
	assert(scan_is_ongoing_);
	scan_is_ongoing_ = false;
#endif

	// Complete the scan only if one is afoot.
	if(vended_scan_) {
		vended_scan_->data_y = TextureAddressGetY(vended_write_area_pointer_);
		vended_scan_->line = write_pointers_.line;
		vended_scan_->scan.end_points[0].data_offset += TextureAddressGetX(vended_write_area_pointer_);
		vended_scan_->scan.end_points[1].data_offset += TextureAddressGetX(vended_write_area_pointer_);
		vended_scan_ = nullptr;
	}
}